

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *Fi)

{
  undefined1 (*pauVar1) [64];
  long *plVar2;
  undefined1 (*pauVar3) [32];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer psVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  double *pdVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  ChVectorDynamic<> *pCVar26;
  char *pcVar27;
  uint uVar28;
  Index index;
  ulong uVar29;
  long lVar30;
  long lVar31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var32;
  double dVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChVectorDynamic<> Fi_local;
  ChMatrixDynamic<> FiR_local;
  ChVectorDynamic<> displ_dt;
  ChVectorDynamic<> displ;
  ChVector<double> mFcent_i;
  ChVector<double> mTgyro_i;
  ChMatrix33<double> Atoabs;
  ChMatrix33<double> AtolocwelB;
  ChMatrix33<double> AtolocwelA;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> local_278;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_258;
  DenseStorage<double,__1,__1,__1,_1> local_248;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_228;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_218;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_208;
  ChVectorDynamic<> *local_1c8;
  double local_1c0;
  long alStack_1b8 [2];
  double dStack_1a8;
  long lStack_1a0;
  long lStack_198;
  long lStack_190;
  undefined1 auStack_188 [16];
  ChMatrixRef local_178;
  ChMatrix33<double> local_150;
  undefined1 local_108 [16];
  double dStack_f8;
  double dStack_f0;
  ChMatrix33<double> local_c0;
  ChMatrix33<double> local_78;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x401,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    __assert_fail("tapered_section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                  ,0x402,
                  "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_218.m_storage.m_data = (double *)0x0;
  local_218.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_218,0xc);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
            (this,&local_218);
  if ((this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      != local_218.m_storage.m_rows) {
LAB_00671cb9:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_258.m_storage.m_data = (double *)0x0;
  local_258.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_258,
             (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows,1);
  dVar33 = (double)(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  if ((double)local_258.m_storage.m_rows != dVar33) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_258,(Index)dVar33,1);
    dVar33 = (double)local_258.m_storage.m_rows;
  }
  if (-1 < (long)dVar33) {
    if (dVar33 != 0.0) {
      memset(local_258.m_storage.m_data,0,(long)dVar33 << 3);
    }
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_258,&this->Km,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_218,(Scalar *)&local_150);
    local_228.m_storage.m_data = (double *)0x0;
    local_228.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_228,0xc);
    GetField_dt(this,(ChVectorDynamic<> *)&local_228);
    if ((this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
        != local_228.m_storage.m_rows) goto LAB_00671cb9;
    local_248.m_cols = 0;
    local_248.m_data = (double *)0x0;
    local_248.m_rows = 0;
    lVar31 = (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows;
    if (lVar31 < 0) {
LAB_00671cef:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_248,lVar31,lVar31,1);
    dVar33 = (double)(this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows;
    if (((double)local_248.m_rows != dVar33) ||
       (local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             4.94065645841247e-324, (double)local_248.m_cols != 4.94065645841247e-324)) {
      if ((long)dVar33 < 0) goto LAB_00671cef;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_248,(Index)dVar33,(Index)dVar33,1);
      dVar33 = (double)local_248.m_rows;
      local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_248.m_cols;
    }
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar33;
    if ((long)((ulong)dVar33 |
              (ulong)local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1]) < 0) {
      pcVar27 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_00671d61;
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_248,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)&local_150,(assign_op<double,_double> *)&local_78);
    local_150.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_248,&this->Rm,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_228,(Scalar *)&local_150);
    if ((local_258.m_storage.m_rows != local_248.m_rows) ||
       ((double)local_248.m_cols != 4.94065645841247e-324)) {
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                   );
    }
    if (0 < local_258.m_storage.m_rows) {
      dVar33 = 0.0;
      do {
        local_258.m_storage.m_data[(long)dVar33] =
             local_248.m_data[(long)dVar33] + local_258.m_storage.m_data[(long)dVar33];
        dVar33 = (double)((long)dVar33 + 1);
      } while ((double)local_258.m_storage.m_rows != dVar33);
    }
    if (-1 < local_258.m_storage.m_rows) {
      uVar29 = local_258.m_storage.m_rows & 0x7ffffffffffffff8;
      if (7 < (ulong)local_258.m_storage.m_rows) {
        auVar40 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        uVar34 = 0;
        do {
          auVar41 = vxorpd_avx512dq(auVar40,*(undefined1 (*) [64])
                                             (local_258.m_storage.m_data + uVar34));
          *(undefined1 (*) [64])(local_258.m_storage.m_data + uVar34) = auVar41;
          uVar34 = uVar34 + 8;
        } while (uVar34 < uVar29);
      }
      if ((long)uVar29 < local_258.m_storage.m_rows) {
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar41 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
        auVar42 = vpbroadcastq_avx512f();
        uVar34 = 0;
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar43 = vporq_avx512f(auVar43,auVar40);
          uVar35 = vpcmpuq_avx512f(auVar43,auVar42,2);
          pdVar14 = local_258.m_storage.m_data + uVar29 + uVar34;
          auVar43._8_8_ = (ulong)((byte)(uVar35 >> 1) & 1) * (long)pdVar14[1];
          auVar43._0_8_ = (ulong)((byte)uVar35 & 1) * (long)*pdVar14;
          auVar43._16_8_ = (ulong)((byte)(uVar35 >> 2) & 1) * (long)pdVar14[2];
          auVar43._24_8_ = (ulong)((byte)(uVar35 >> 3) & 1) * (long)pdVar14[3];
          auVar43._32_8_ = (ulong)((byte)(uVar35 >> 4) & 1) * (long)pdVar14[4];
          auVar43._40_8_ = (ulong)((byte)(uVar35 >> 5) & 1) * (long)pdVar14[5];
          auVar43._48_8_ = (ulong)((byte)(uVar35 >> 6) & 1) * (long)pdVar14[6];
          auVar43._56_8_ = (uVar35 >> 7) * (long)pdVar14[7];
          auVar43 = vxorpd_avx512dq(auVar43,auVar41);
          pdVar14 = local_258.m_storage.m_data + uVar29 + uVar34;
          bVar16 = (bool)((byte)uVar35 & 1);
          bVar17 = (bool)((byte)(uVar35 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar35 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar35 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar35 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar35 >> 5) & 1);
          bVar22 = (bool)((byte)(uVar35 >> 6) & 1);
          *pdVar14 = (double)((ulong)bVar16 * auVar43._0_8_ | (ulong)!bVar16 * (long)*pdVar14);
          pdVar14[1] = (double)((ulong)bVar17 * auVar43._8_8_ | (ulong)!bVar17 * (long)pdVar14[1]);
          pdVar14[2] = (double)((ulong)bVar18 * auVar43._16_8_ | (ulong)!bVar18 * (long)pdVar14[2]);
          pdVar14[3] = (double)((ulong)bVar19 * auVar43._24_8_ | (ulong)!bVar19 * (long)pdVar14[3]);
          pdVar14[4] = (double)((ulong)bVar20 * auVar43._32_8_ | (ulong)!bVar20 * (long)pdVar14[4]);
          pdVar14[5] = (double)((ulong)bVar21 * auVar43._40_8_ | (ulong)!bVar21 * (long)pdVar14[5]);
          pdVar14[6] = (double)((ulong)bVar22 * auVar43._48_8_ | (ulong)!bVar22 * (long)pdVar14[6]);
          pdVar14[7] = (double)((uVar35 >> 7) * auVar43._56_8_ |
                               (ulong)!SUB81(uVar35 >> 7,0) * (long)pdVar14[7]);
          uVar34 = uVar34 + 8;
        } while ((((uint)local_258.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar34);
      }
      ChMatrix33<double>::ChMatrix33(&local_150,&this->q_element_abs_rot);
      psVar10 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar11 = (psVar10->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var32 = (psVar10->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
        }
      }
      auVar38 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
      auVar39 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
      auVar55 = vpermpd_avx2(auVar38,1);
      auVar45._0_8_ = *(ulong *)&peVar11->field_0x40 ^ 0x8000000000000000;
      auVar45._8_8_ = *(ulong *)&peVar11->field_0x48 ^ 0x8000000000000000;
      auVar45._16_8_ = 0x8000000000000000;
      auVar45._24_8_ = 0x8000000000000000;
      uVar29 = *(ulong *)&peVar11->field_0x50 ^ 0x8000000000000000;
      auVar52._24_8_ = 0x8000000000000000;
      auVar52._16_8_ = uVar29;
      auVar23 = vpermpd_avx2(auVar45,0xd0);
      auVar60._8_8_ = uVar29;
      auVar60._0_8_ = uVar29;
      auVar60._16_8_ = uVar29;
      auVar60._24_8_ = uVar29;
      auVar52._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
      auVar49._16_8_ = *(ulong *)&peVar11->field_0x40;
      auVar49._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
      auVar49._24_8_ = 0;
      auVar45 = vpermpd_avx2(auVar45,0x11);
      auVar23 = vblendpd_avx(auVar23,ZEXT832(*(ulong *)&peVar11->field_0x40),1);
      auVar23 = vblendpd_avx(auVar23,auVar60,8);
      auVar52 = vpermpd_avx2(auVar52,0x24);
      auVar45 = vshufpd_avx(auVar49,auVar45,9);
      auVar58._0_8_ = auVar55._0_8_ * auVar23._0_8_;
      auVar58._8_8_ = auVar55._8_8_ * auVar23._8_8_;
      auVar58._16_8_ = auVar55._16_8_ * auVar23._16_8_;
      auVar58._24_8_ = auVar55._24_8_ * auVar23._24_8_;
      uVar4 = *(undefined8 *)&peVar11->field_0x38;
      auVar23._8_8_ = uVar4;
      auVar23._0_8_ = uVar4;
      auVar23._16_8_ = uVar4;
      auVar23._24_8_ = uVar4;
      auVar38 = vfmadd231pd_avx512vl(auVar58,auVar38,auVar23);
      dVar33 = (this->q_element_abs_rot).m_data[2];
      auVar55._8_8_ = dVar33;
      auVar55._0_8_ = dVar33;
      dVar33 = (this->q_element_abs_rot).m_data[1];
      auVar55._24_8_ = dVar33;
      auVar55._16_8_ = dVar33;
      auVar24 = vfmadd213pd_fma(auVar55,auVar52,auVar38);
      auVar24 = vfmadd213pd_fma(auVar45,auVar39,ZEXT1632(auVar24));
      local_c0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array._0_32_ =
           ZEXT1632(auVar24);
      ChMatrix33<double>::ChMatrix33(&local_78,(ChQuaternion<double> *)&local_c0);
      local_1c8 = Fi;
      if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var32);
      }
      psVar10 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar11 = psVar10[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var32 = psVar10[1].
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
        }
      }
      auVar38 = *(undefined1 (*) [32])(this->q_element_abs_rot).m_data;
      auVar39 = vpermpd_avx2(*(undefined1 (*) [32])((this->q_element_abs_rot).m_data + 2),0x15);
      auVar46._0_8_ = *(ulong *)&peVar11->field_0x40 ^ 0x8000000000000000;
      auVar46._8_8_ = *(ulong *)&peVar11->field_0x48 ^ 0x8000000000000000;
      auVar46._16_8_ = 0x8000000000000000;
      auVar46._24_8_ = 0x8000000000000000;
      uVar29 = *(ulong *)&peVar11->field_0x50 ^ 0x8000000000000000;
      auVar53._24_8_ = 0x8000000000000000;
      auVar53._16_8_ = uVar29;
      auVar23 = vpermpd_avx2(auVar46,0xd0);
      auVar61._8_8_ = uVar29;
      auVar61._0_8_ = uVar29;
      auVar61._16_8_ = uVar29;
      auVar61._24_8_ = uVar29;
      auVar53._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
      auVar50._16_8_ = *(ulong *)&peVar11->field_0x40;
      auVar50._0_16_ = *(undefined1 (*) [16])&peVar11->field_0x48;
      auVar50._24_8_ = 0;
      auVar45 = vpermpd_avx2(auVar46,0x11);
      auVar23 = vblendpd_avx(auVar23,ZEXT832(*(ulong *)&peVar11->field_0x40),1);
      auVar23 = vblendpd_avx(auVar23,auVar61,8);
      auVar55 = vpermpd_avx2(auVar53,0x24);
      auVar45 = vshufpd_avx(auVar50,auVar45,9);
      auVar52 = vpermpd_avx2(auVar38,1);
      auVar59._0_8_ = auVar52._0_8_ * auVar23._0_8_;
      auVar59._8_8_ = auVar52._8_8_ * auVar23._8_8_;
      auVar59._16_8_ = auVar52._16_8_ * auVar23._16_8_;
      auVar59._24_8_ = auVar52._24_8_ * auVar23._24_8_;
      uVar4 = *(undefined8 *)&peVar11->field_0x38;
      auVar25._8_8_ = uVar4;
      auVar25._0_8_ = uVar4;
      auVar25._16_8_ = uVar4;
      auVar25._24_8_ = uVar4;
      auVar38 = vfmadd231pd_avx512vl(auVar59,auVar38,auVar25);
      dVar33 = (this->q_element_abs_rot).m_data[2];
      auVar56._8_8_ = dVar33;
      auVar56._0_8_ = dVar33;
      dVar33 = (this->q_element_abs_rot).m_data[1];
      auVar56._24_8_ = dVar33;
      auVar56._16_8_ = dVar33;
      auVar24 = vfmadd213pd_fma(auVar56,auVar55,auVar38);
      auVar24 = vfmadd213pd_fma(auVar45,auVar39,ZEXT1632(auVar24));
      local_208.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ._0_32_ = ZEXT1632(auVar24);
      ChMatrix33<double>::ChMatrix33(&local_c0,(ChQuaternion<double> *)&local_208);
      if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var32);
      }
      local_278.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (ChMatrix33<double> **)0x0;
      local_278.
      super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (ChMatrix33<double> **)0x0;
      local_208.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)&local_150;
      std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
      _M_realloc_insert<chrono::ChMatrix33<double>*>
                ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>> *)
                 &local_278,(iterator)0x0,(ChMatrix33<double> **)&local_208);
      pCVar26 = local_1c8;
      if (local_278.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_278.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_208.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_78;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_278,
                   (iterator)
                   local_278.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_208);
      }
      else {
        *local_278.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_78;
        local_278.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_278.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (local_278.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_278.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_208.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (PointerType)&local_150;
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_278,
                   (iterator)
                   local_278.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_208);
      }
      else {
        *local_278.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_150;
        local_278.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_278.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_208.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)&local_c0;
      if (local_278.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_278.
          super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
        _M_realloc_insert<chrono::ChMatrix33<double>*>
                  ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                    *)&local_278,
                   (iterator)
                   local_278.
                   super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(ChMatrix33<double> **)&local_208);
      }
      else {
        *local_278.
         super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &local_c0;
        local_278.
        super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_278.
             super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_208.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_cols = 0;
      local_208.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      local_208.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_rows = 0;
      local_208.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = local_258.m_storage.m_rows;
      local_208.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = local_258.m_storage.m_data;
      local_208.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 1;
      local_208.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      if (local_258.m_storage.m_rows < 0 && local_258.m_storage.m_data != (double *)0x0) {
        pcVar27 = 
        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
        ;
      }
      else {
        local_178.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_208.
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 1;
        local_178.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        local_178.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value =
             (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
        local_178.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 1;
        if (-1 < local_178.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value ||
            local_178.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data == (double *)0x0) {
          local_178.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 1;
          ChMatrixCorotation::ComputeCK(&local_208,&local_278,4,&local_178);
          if (local_208.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data != (double *)0x0) {
            free((void *)local_208.m_object.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_data[-1]);
          }
          local_208.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = 0;
          lStack_198 = 0;
          local_208.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          ._0_16_ = ZEXT816(0);
          dStack_1a8 = 0.0;
          lStack_1a0 = 0;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar37 = 0x18;
            lVar31 = 0;
            uVar29 = 0;
            auStack_188._8_8_ = 0;
            auStack_188._0_8_ = (this->super_ChElementBeam).length * 0.5;
            _local_108 = vbroadcastsd_avx512f(auStack_188);
            do {
              peVar12 = (this->tapered_section).
                        super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if (uVar29 == 0) {
                peVar13 = (peVar12->sectionA).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                p_Var32 = (peVar12->sectionA).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
                  }
                }
                ChFrameMoving<double>::GetWvel_loc
                          ((ChFrameMoving<double> *)
                           &(((((this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->super_ChNodeFEAbase).field_0x18);
                (**(code **)(*(long *)&(peVar13->super_ChBeamSectionRayleighAdvancedGeneric).
                                       super_ChBeamSectionEulerAdvancedGeneric.
                                       super_ChBeamSectionEuler + 0x80))
                          (peVar13,&local_208,&dStack_1a8,&local_1c0);
              }
              else {
                peVar13 = (peVar12->sectionB).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                p_Var32 = (peVar12->sectionB).
                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var32->_M_use_count = p_Var32->_M_use_count + 1;
                  }
                }
                ChFrameMoving<double>::GetWvel_loc
                          ((ChFrameMoving<double> *)
                           &(((this->nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar29].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase).field_0x18);
                (**(code **)(*(long *)&(peVar13->super_ChBeamSectionRayleighAdvancedGeneric).
                                       super_ChBeamSectionEulerAdvancedGeneric.
                                       super_ChBeamSectionEuler + 0x80))
                          (peVar13,&local_208,&dStack_1a8,&local_1c0);
              }
              if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var32);
              }
              auVar44._8_8_ = 0;
              auVar44._0_8_ =
                   local_208.
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
              auVar54._8_8_ = 0;
              auVar54._0_8_ =
                   local_208.
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   .
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value;
              peVar11 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar29].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = *(ulong *)&peVar11->field_0x58;
              auVar51._8_8_ = 0;
              auVar51._0_8_ =
                   (double)local_208.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar11->field_0x60;
              auVar24 = vfmadd231sd_fma(auVar51,auVar44,auVar24);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)&peVar11->field_0x70;
              auVar57._8_8_ = 0;
              auVar57._0_8_ =
                   (double)local_208.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar11->field_0x78;
              auVar5 = vfmadd231sd_fma(auVar57,auVar44,auVar5);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)&peVar11->field_0x88;
              auVar48._8_8_ = 0;
              auVar48._0_8_ =
                   (double)local_208.
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           .
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value * *(double *)&peVar11->field_0x90;
              auVar6 = vfmadd231sd_fma(auVar48,auVar44,auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)&peVar11->field_0x68;
              auVar24 = vfmadd231sd_fma(auVar24,auVar54,auVar7);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = *(ulong *)&peVar11->field_0x80;
              auVar5 = vfmadd231sd_fma(auVar5,auVar54,auVar8);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)&peVar11->field_0x98;
              auVar6 = vfmadd231sd_fma(auVar6,auVar54,auVar9);
              local_1c0 = auVar24._0_8_;
              alStack_1b8[0] = auVar5._0_8_;
              alStack_1b8[1] = auVar6._0_8_;
              lVar30 = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows + -3;
              if (lVar30 < (long)(uVar29 * 6)) goto LAB_00671c97;
              pdVar14 = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar28 = 3;
              pauVar1 = (undefined1 (*) [64])(pdVar14 + uVar29 * 6);
              if (((ulong)pauVar1 & 7) == 0) {
                uVar36 = -((uint)((ulong)pauVar1 >> 3) & 0x1fffffff) & 7;
                if (uVar36 < 3) {
                  uVar28 = uVar36;
                }
                if (uVar36 != 0) goto LAB_00671adb;
              }
              else {
LAB_00671adb:
                auVar40 = vpbroadcastq_avx512f();
                uVar34 = vpcmpuq_avx512f(auVar40,_DAT_00974fc0,5);
                bVar15 = (byte)uVar34;
                auVar40._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * auVar5._0_8_;
                auVar40._0_8_ = (ulong)(bVar15 & 1) * (long)auVar24._0_8_;
                auVar40._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * auVar6._0_8_;
                auVar40._24_8_ = (ulong)((byte)(uVar34 >> 3) & 1) * (long)dStack_1a8;
                auVar40._32_8_ = (ulong)((byte)(uVar34 >> 4) & 1) * lStack_1a0;
                auVar40._40_8_ = (ulong)((byte)(uVar34 >> 5) & 1) * lStack_198;
                auVar40._48_8_ = (ulong)((byte)(uVar34 >> 6) & 1) * lStack_190;
                auVar40._56_8_ = (uVar34 >> 7) * auStack_188._0_8_;
                auVar41._8_8_ =
                     (ulong)((byte)(uVar34 >> 1) & 1) * (long)*(double *)((long)*pauVar1 + 8);
                auVar41._0_8_ = (ulong)(bVar15 & 1) * (long)*(double *)*pauVar1;
                auVar41._16_8_ =
                     (ulong)((byte)(uVar34 >> 2) & 1) * (long)*(double *)((long)*pauVar1 + 0x10);
                auVar41._24_8_ =
                     (ulong)((byte)(uVar34 >> 3) & 1) * (long)*(double *)((long)*pauVar1 + 0x18);
                auVar41._32_8_ =
                     (ulong)((byte)(uVar34 >> 4) & 1) * (long)*(double *)((long)*pauVar1 + 0x20);
                auVar41._40_8_ =
                     (ulong)((byte)(uVar34 >> 5) & 1) * (long)*(double *)((long)*pauVar1 + 0x28);
                auVar41._48_8_ =
                     (ulong)((byte)(uVar34 >> 6) & 1) * (long)*(double *)((long)*pauVar1 + 0x30);
                auVar41._56_8_ = (uVar34 >> 7) * (long)*(double *)((long)*pauVar1 + 0x38);
                auVar40 = vmulpd_avx512f(auVar40,_local_108);
                auVar40 = vsubpd_avx512f(auVar41,auVar40);
                auVar42._0_8_ =
                     (ulong)(bVar15 & 1) * auVar40._0_8_ |
                     (ulong)!(bool)(bVar15 & 1) * (long)*(double *)*pauVar1;
                bVar16 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar42._8_8_ =
                     (ulong)bVar16 * auVar40._8_8_ |
                     (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 8);
                bVar16 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar42._16_8_ =
                     (ulong)bVar16 * auVar40._16_8_ |
                     (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x10);
                bVar16 = (bool)((byte)(uVar34 >> 3) & 1);
                auVar42._24_8_ =
                     (ulong)bVar16 * auVar40._24_8_ |
                     (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x18);
                bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                auVar42._32_8_ =
                     (ulong)bVar16 * auVar40._32_8_ |
                     (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x20);
                bVar16 = (bool)((byte)(uVar34 >> 5) & 1);
                auVar42._40_8_ =
                     (ulong)bVar16 * auVar40._40_8_ |
                     (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x28);
                bVar16 = (bool)((byte)(uVar34 >> 6) & 1);
                auVar42._48_8_ =
                     (ulong)bVar16 * auVar40._48_8_ |
                     (ulong)!bVar16 * (long)*(double *)((long)*pauVar1 + 0x30);
                auVar42._56_8_ =
                     (uVar34 >> 7) * auVar40._56_8_ |
                     (ulong)!SUB81(uVar34 >> 7,0) * (long)*(double *)((long)*pauVar1 + 0x38);
                *pauVar1 = auVar42;
              }
              if (uVar28 < 3) {
                uVar35 = (ulong)(uVar28 << 3);
                auVar38 = vpbroadcastq_avx512vl();
                uVar34 = vpcmpuq_avx512vl(auVar38,_DAT_00955380,5);
                uVar34 = uVar34 & 0xf;
                bVar15 = (byte)uVar34;
                plVar2 = (long *)((long)*pauVar1 + uVar35);
                auVar38._8_8_ = (ulong)((byte)(uVar34 >> 1) & 1) * plVar2[1];
                auVar38._0_8_ = (ulong)(bVar15 & 1) * *plVar2;
                auVar38._16_8_ = (ulong)((byte)(uVar34 >> 2) & 1) * plVar2[2];
                auVar38._24_8_ = (uVar34 >> 3) * plVar2[3];
                auVar47._0_8_ =
                     (double)((ulong)(bVar15 & 1) * *(long *)((long)&local_1c0 + uVar35)) *
                     (double)local_108._0_8_;
                auVar47._8_8_ =
                     (double)((ulong)((byte)(uVar34 >> 1) & 1) *
                             *(long *)((long)alStack_1b8 + uVar35)) * (double)local_108._8_8_;
                auVar47._16_8_ =
                     (double)((ulong)((byte)(uVar34 >> 2) & 1) *
                             *(long *)((long)alStack_1b8 + uVar35 + 8)) * dStack_f8;
                auVar47._24_8_ =
                     (double)((uVar34 >> 3) * *(long *)((long)&dStack_1a8 + uVar35)) * dStack_f0;
                auVar38 = vsubpd_avx(auVar38,auVar47);
                pauVar3 = (undefined1 (*) [32])((long)*pauVar1 + uVar35);
                auVar39._0_8_ =
                     (ulong)(bVar15 & 1) * auVar38._0_8_ |
                     (ulong)!(bool)(bVar15 & 1) * *(long *)*pauVar3;
                bVar16 = (bool)((byte)(uVar34 >> 1) & 1);
                auVar39._8_8_ =
                     (ulong)bVar16 * auVar38._8_8_ | (ulong)!bVar16 * *(long *)(*pauVar3 + 8);
                bVar16 = (bool)((byte)(uVar34 >> 2) & 1);
                auVar39._16_8_ =
                     (ulong)bVar16 * auVar38._16_8_ | (ulong)!bVar16 * *(long *)(*pauVar3 + 0x10);
                auVar39._24_8_ =
                     (uVar34 >> 3) * auVar38._24_8_ |
                     (ulong)!SUB81(uVar34 >> 3,0) * *(long *)(*pauVar3 + 0x18);
                *pauVar3 = auVar39;
              }
              if (lVar30 < (long)(uVar29 * 6 + 3)) {
LAB_00671c97:
                __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                              ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                              "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                             );
              }
              uVar34 = 3;
              if (((ulong)(pdVar14 + uVar29 * 6 + 3) & 7) == 0) {
                uVar28 = -((uint)((ulong)(pdVar14 + uVar29 * 6 + 3) >> 3) & 0x1fffffff) & 7;
                if ((ulong)uVar28 < 3) {
                  uVar34 = (ulong)uVar28;
                }
                if (uVar28 != 0) goto LAB_00671b96;
              }
              else {
LAB_00671b96:
                uVar35 = 0;
                do {
                  *(double *)((long)pdVar14 + uVar35 * 8 + lVar37) =
                       *(double *)((long)pdVar14 + uVar35 * 8 + lVar37) -
                       (double)auStack_188._0_8_ * (&dStack_1a8)[uVar35];
                  uVar35 = uVar35 + 1;
                } while (uVar34 != uVar35);
              }
              if (uVar34 < 3) {
                lVar30 = uVar34 + 3;
                do {
                  *(double *)((long)pdVar14 + lVar30 * 8 + lVar31) =
                       *(double *)((long)pdVar14 + lVar30 * 8 + lVar31) -
                       (double)auStack_188._0_8_ * (&local_1c0)[lVar30];
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 6);
              }
              uVar29 = uVar29 + 1;
              lVar37 = lVar37 + 0x30;
              lVar31 = lVar31 + 0x30;
            } while (uVar29 < (ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          if (local_278.
              super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.
                            super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.
                                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.
                                  super__Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_248.m_data != (double *)0x0) {
            free((void *)local_248.m_data[-1]);
          }
          if (local_228.m_storage.m_data != (double *)0x0) {
            free((void *)local_228.m_storage.m_data[-1]);
          }
          if (local_258.m_storage.m_data != (double *)0x0) {
            free((void *)local_258.m_storage.m_data[-1]);
          }
          if (local_218.m_storage.m_data != (double *)0x0) {
            free((void *)local_218.m_storage.m_data[-1]);
          }
          return;
        }
        pcVar27 = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
        ;
      }
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar27);
    }
  }
  pcVar27 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_00671d61:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar27);
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);
    assert(tapered_section);

    // set up vector of nodal displacements and small rotations (in local element system)
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> Fi_local = this->Km * displ;

    // set up vector of nodal velocities (in local element system)
    ChVectorDynamic<> displ_dt(12);
    this->GetField_dt(displ_dt);

    // ChMatrixDynamic<> FiR_local = this->tapered_section->GetBeamRaleyghDamping() * this->Km * displ_dt;
    ChMatrixDynamic<> FiR_local = this->Rm * displ_dt;

    Fi_local += FiR_local;
    Fi_local *= -1.0;

    //
    // Corotate local internal loads
    //

    // Fi = C * Fi_local  with C block-diagonal rotations A  , for nodal forces in abs. frame
    ChMatrix33<> Atoabs(this->q_element_abs_rot);
    ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
    std::vector<ChMatrix33<>*> R;
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelA);
    R.push_back(&Atoabs);
    R.push_back(&AtolocwelB);
    ChMatrixCorotation::ComputeCK(Fi_local, R, 4, Fi);

    // Add also inertial quadratic terms: gyroscopic and centrifugal

    // CASE OF LUMPED MASS - fast
    double node_multiplier = 0.5 * length;
    ChVector<> mFcent_i;
    ChVector<> mTgyro_i;
    for (int i = 0; i < nodes.size(); ++i) {
        // int stride = i * 6;
        if (i == 0) {
            this->tapered_section->GetSectionA()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        } else {  // i==1
            this->tapered_section->GetSectionB()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, nodes[i]->GetWvel_loc());
        }
        ChQuaternion<> q_i(nodes[i]->GetRot());
        Fi.segment(i * 6, 3) -= node_multiplier * (nodes[i]->GetA() * mFcent_i).eigen();
        Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
    }

#ifdef BEAM_VERBOSE
    GetLog() << "\nInternal forces (local): \n";
    for (int c = 0; c < 6; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << FiK_local(c) << "  ";
    GetLog() << "\n\nInternal forces (ABS) : \n";
    for (int c = 0; c < 6; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
    for (int c = 6; c < 12; c++)
        GetLog() << Fi(c) << "  ";
    GetLog() << "\n";
#endif
}